

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_input.hpp
# Opt level: O0

void __thiscall
tao::pegtl::
memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>::
memory_input<char_const(&)[1]>
          (memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>
           *this,string *in_string,char (*in_source) [1])

{
  char *in_begin;
  size_t in_size;
  char (*in_source_local) [1];
  string *in_string_local;
  memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  in_begin = (char *)std::__cxx11::string::data();
  in_size = std::__cxx11::string::size();
  memory_input<char_const(&)[1]>(this,in_begin,in_size,in_source);
  return;
}

Assistant:

memory_input( const std::string& in_string, T&& in_source ) noexcept( std::is_nothrow_constructible< Source, T&& >::value )
            : memory_input( in_string.data(), in_string.size(), std::forward< T >( in_source ) )
         {
         }